

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O2

shared_ptr<nigel::IM_Constant>
nigel::IM_Constant::fromAstLiteral(shared_ptr<nigel::AstLiteral> *ast)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Constant> sVar1;
  
  Token::as<nigel::Token_NumberL>((Token *)&stack0xffffffffffffffe0);
  std::make_shared<nigel::IM_Constant,int_const&>((int *)ast);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ast;
  return (shared_ptr<nigel::IM_Constant>)
         sVar1.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<IM_Constant> fromAstLiteral( std::shared_ptr<AstLiteral> ast )
		{
			return std::make_shared<IM_Constant>( ast->token->as<Token_NumberL>()->number );
		}